

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O1

int __thiscall CaDiCaL::Internal::backward_true_satisfiable(Internal *this)

{
  anon_struct_8_2_4505284c_for_terminate *paVar1;
  anon_struct_16_2_20cb3f79_for_constant_forward_backward *paVar2;
  int iVar3;
  Terminator *pTVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int in_EAX;
  undefined7 extraout_var;
  long lVar9;
  char *pcVar8;
  
  lVar9 = (long)this->max_var;
  bVar5 = lVar9 < 1;
  if (0 < lVar9) {
    do {
      if (this->termination_forced != false) {
LAB_0083d619:
        if (0 < this->level) {
          backtrack(this,0);
        }
        in_EAX = -1;
LAB_0083d631:
        if (this->conflict != (Clause *)0x0) {
          this->conflict = (Clause *)0x0;
        }
        break;
      }
      iVar3 = (this->lim).terminate.forced;
      if ((iVar3 != 0) && ((this->lim).terminate.forced = iVar3 + -1, iVar3 == 1)) {
LAB_0083d612:
        this->termination_forced = true;
        goto LAB_0083d619;
      }
      pTVar4 = this->external->terminator;
      if (pTVar4 != (Terminator *)0x0) {
        paVar1 = &(this->lim).terminate;
        iVar3 = paVar1->check;
        paVar1->check = paVar1->check + -1;
        if (iVar3 == 0) {
          (this->lim).terminate.check = (this->opts).terminateint * 10;
          cVar6 = (**(code **)(*(long *)pTVar4 + 0x10))();
          if (cVar6 != '\0') goto LAB_0083d612;
        }
      }
      pcVar8 = this->vals;
      if (pcVar8[lVar9] == '\0') {
        search_assume_decision(this,(int)lVar9);
        bVar7 = propagate(this);
        pcVar8 = (char *)CONCAT71(extraout_var,bVar7);
        if (bVar7) goto LAB_0083d5f9;
        if (0 < this->level) {
          backtrack(this,0);
        }
        in_EAX = 0;
        goto LAB_0083d631;
      }
LAB_0083d5f9:
      in_EAX = (int)pcVar8;
      bVar5 = lVar9 < 2;
      bVar7 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar7);
  }
  if (bVar5) {
    if (this->internal != (Internal *)0x0) {
      verbose(this->internal,1,"backward assuming variables true satisfies formula");
    }
    paVar2 = &(this->stats).lucky.backward;
    paVar2->one = paVar2->one + 1;
    in_EAX = 10;
  }
  return in_EAX;
}

Assistant:

int Internal::backward_true_satisfiable () {
  LOG ("checking decreasing variable index true assignment");
  assert (!unsat);
  assert (!level);
  assert (assumptions.empty ());
  for (int idx = max_var; idx > 0; idx--) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (!propagate ())
      return unlucky (0);
  }
  VERBOSE (1, "backward assuming variables true satisfies formula");
  assert (satisfied ());
  stats.lucky.backward.one++;
  return 10;
}